

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::PortalImageInfiniteLight::PortalImageInfiniteLight
          (PortalImageInfiniteLight *this,Transform *renderFromLight,Image *equiAreaImage,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *p,Allocator alloc)

{
  Image *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  pointer pcVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  pointer pPVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  _Any_data _Var30;
  memory_resource *pmVar31;
  Allocator alloc_00;
  allocator_type allocator;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar32;
  long lVar33;
  _Alloc_hider _Var34;
  long *plVar35;
  long in_FS_OFFSET;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  MediumInterface MVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  float local_308;
  float local_2d8;
  float local_2c8;
  size_t vb;
  undefined4 uStack_268;
  undefined1 local_260 [16];
  undefined1 local_250 [32];
  long local_230 [2];
  long local_220 [12];
  ColorEncodingHandle local_1c0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_1b8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_198;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_178;
  ImageChannelDesc channelDesc;
  undefined8 *local_118;
  undefined8 uStack_110;
  code *pcStack_108;
  code *pcStack_100;
  Array2D<float> d;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  long *local_b8 [2];
  long local_a8 [2];
  _Any_data local_98;
  code *local_88;
  code *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  Array2D<float> local_58;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  _uStack_268 = vb;
  MVar41._0_12_ = ZEXT812(0);
  MVar41.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits._4_4_ = 0;
  (this->super_LightBase).type = Infinite;
  (this->super_LightBase).mediumInterface = MVar41;
  uVar6 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar16 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar17 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar18 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar19 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar20 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar21 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar22 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar23 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar24 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar25 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar26 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar27 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar28 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar29 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar16;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar17;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar18;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar19;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar20;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar21;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar22;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar23;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar24;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar25;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar26;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar27;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar28;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar29;
  *(long *)(in_FS_OFFSET + -0x550) = *(long *)(in_FS_OFFSET + -0x550) + 1;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  pcVar7 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->filename,pcVar7,pcVar7 + filename->_M_string_length);
  this_00 = &this->image;
  (this->image).format = U256;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar31 = pstd::pmr::new_delete_resource();
  (this->image).channelNames.alloc.memoryResource = pmVar31;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (this->image).channelNames.nAlloc = 0;
  (this->image).channelNames.nStored = 0;
  (this->image).p8.alloc.memoryResource = alloc.memoryResource;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  (this->image).p16.alloc.memoryResource = alloc.memoryResource;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  (this->image).p16.nStored = 0;
  (this->image).p32.alloc.memoryResource = alloc.memoryResource;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  (this->image).p32.nStored = 0;
  this->imageColorSpace = imageColorSpace;
  this->scale = scale;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  *(undefined8 *)&(this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  *(undefined1 (*) [32])&(this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y =
       ZEXT832(0) << 0x20;
  *(undefined1 (*) [32])(this->portal).values = ZEXT832(0) << 0x20;
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D(&this->distribution,alloc);
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  vb = (size_t)local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_250._0_8_ = local_250 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"G","");
  _Var34._M_p = (pointer)local_220;
  local_230[0] = (long)_Var34._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&channelDesc,equiAreaImage,requestedChannels);
  lVar33 = -0x60;
  do {
    if ((long *)_Var34._M_p != *(long **)((long)_Var34._M_p + -0x10)) {
      operator_delete(*(long **)((long)_Var34._M_p + -0x10),*(long *)_Var34._M_p + 1);
    }
    _Var34._M_p = _Var34._M_p + -0x20;
    lVar33 = lVar33 + 0x20;
  } while (lVar33 != 0);
  if (channelDesc.offset.nStored == 0) {
    ErrorExit<std::__cxx11::string_const&>
              ("%s: image used for PortalImageInfiniteLight doesn\'t have R, G, B channels.",
               filename);
  }
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = 3;
  vb = channelDesc.offset.nStored;
  if (channelDesc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c6,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x60b352,
               (char (*) [19])"channelDesc.size()",(char (*) [2])0x60b352,(int *)&d,
               (char (*) [19])"channelDesc.size()",(unsigned_long *)&vb);
  }
  paVar32 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar32 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar32->fixed[0] != 0) {
LAB_003b9f05:
    LogFatal<char_const(&)[25]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x3c7,"Check failed: %s",(char (*) [25])"channelDesc.IsIdentity()");
  }
  paVar32 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar32 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar32->fixed[1] != 1) goto LAB_003b9f05;
  paVar32 = &channelDesc.offset.field_2;
  if (channelDesc.offset.ptr != (int *)0x0) {
    paVar32 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
               *)channelDesc.offset.ptr;
  }
  if (paVar32->fixed[2] != 2) goto LAB_003b9f05;
  TVar8 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (TVar8.x != TVar8.y) {
    vb._0_4_ = TVar8.x;
    vb._4_4_ = TVar8.y;
    d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = TVar8;
    ErrorExit<std::__cxx11::string_const&,int,int>
              ("%s: image resolution (%d, %d) is non-square. It\'s unlikely this is an equirect environment map."
               ,filename,(int *)&vb,&d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
  }
  lVar33 = (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar33 != 0x30) {
    vb = (lVar33 >> 2) * -0x5555555555555555;
    ErrorExit<unsigned_long>("Expected 4 vertices for infinite light portal but given %d",&vb);
  }
  lVar33 = 0;
  do {
    pPVar9 = (p->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z + lVar33) =
         *(undefined4 *)((long)&(pPVar9->super_Tuple3<pbrt::Point3,_float>).z + lVar33);
    *(undefined8 *)((long)&(this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x + lVar33) =
         *(undefined8 *)((long)&(pPVar9->super_Tuple3<pbrt::Point3,_float>).x + lVar33);
    lVar33 = lVar33 + 0xc;
  } while (lVar33 != 0x30);
  fVar43 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.y;
  fVar52 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y;
  fVar1 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.x;
  fVar50 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x;
  fVar2 = (this->portal).values[1].super_Tuple3<pbrt::Point3,_float>.z;
  fVar3 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z;
  fVar51 = fVar52 - fVar43;
  fVar49 = fVar50 - fVar1;
  fVar12 = fVar3 - fVar2;
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar51)),ZEXT416((uint)fVar49),
                            ZEXT416((uint)fVar49));
  auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  auVar44 = vsqrtss_avx(auVar44,auVar44);
  fVar48 = auVar44._0_4_;
  fVar51 = fVar51 / fVar48;
  fVar4 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.y;
  fVar49 = fVar49 / fVar48;
  fVar5 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.x;
  auVar39 = ZEXT416((uint)(fVar12 / fVar48));
  fVar12 = (this->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z;
  fVar52 = fVar52 - fVar4;
  fVar50 = fVar50 - fVar5;
  fVar3 = fVar3 - fVar12;
  auVar44 = vinsertps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar4),0x10);
  fVar43 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar11._4_4_ = fVar43;
  auVar11._0_4_ = fVar43;
  auVar11._8_4_ = fVar43;
  auVar11._12_4_ = fVar43;
  auVar36 = vsubps_avx512vl(auVar44,auVar11);
  auVar44 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar12),0x10);
  fVar43 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar13._4_4_ = fVar43;
  auVar13._0_4_ = fVar43;
  auVar13._8_4_ = fVar43;
  auVar13._12_4_ = fVar43;
  auVar37 = vsubps_avx512vl(auVar44,auVar13);
  auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * fVar52)),ZEXT416((uint)fVar50),
                            ZEXT416((uint)fVar50));
  auVar44 = vfmadd231ss_fma(auVar44,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  auVar11 = vsqrtss_avx(auVar44,auVar44);
  auVar44 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar5),0x10);
  fVar43 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar38._4_4_ = fVar43;
  auVar38._0_4_ = fVar43;
  auVar38._8_4_ = fVar43;
  auVar38._12_4_ = fVar43;
  auVar38 = vsubps_avx512vl(auVar44,auVar38);
  auVar44 = vblendps_avx(auVar38,auVar36,2);
  fVar43 = auVar11._0_4_;
  fVar50 = fVar50 / fVar43;
  auVar46._0_4_ = auVar36._0_4_ * auVar36._0_4_;
  auVar46._4_4_ = auVar36._4_4_ * auVar36._4_4_;
  auVar46._8_4_ = auVar36._8_4_ * auVar36._8_4_;
  auVar46._12_4_ = auVar36._12_4_ * auVar36._12_4_;
  fVar52 = fVar52 / fVar43;
  auVar40 = ZEXT416((uint)(fVar3 / fVar43));
  auVar13 = vfmadd231ps_fma(auVar46,auVar38,auVar38);
  auVar11 = vblendps_avx(auVar36,auVar38,2);
  auVar13 = vfmadd231ps_fma(auVar13,auVar37,auVar37);
  auVar13 = vsqrtps_avx(auVar13);
  auVar11 = vdivps_avx(auVar11,auVar13);
  auVar44 = vdivps_avx(auVar44,auVar13);
  auVar13 = vdivps_avx(auVar37,auVar13);
  fVar43 = auVar11._0_4_;
  auVar38 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * fVar43)),auVar44,ZEXT416((uint)fVar50));
  auVar38 = vfmadd231ss_fma(auVar38,auVar13,auVar40);
  auVar36._8_4_ = 0x7fffffff;
  auVar36._0_8_ = 0x7fffffff7fffffff;
  auVar36._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx512vl(ZEXT416((uint)(auVar38._0_4_ + -1.0)),auVar36);
  auVar38 = vmovshdup_avx(auVar11);
  auVar36 = vmovshdup_avx(auVar44);
  local_2d8 = auVar36._0_4_;
  local_2c8 = auVar38._0_4_;
  if (0.001 < auVar37._0_4_) {
LAB_003b9857:
    _uStack_268 = 0;
    vb = (size_t)local_260;
    local_260._0_8_ = local_260._0_8_ & 0xffffffffffffff00;
    local_78 = auVar40;
    local_68 = auVar39;
    detail::stringPrintfRecursive
              ((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral");
    Error((FileLoc *)0x0,(char *)vb);
    auVar39 = local_68;
    auVar40 = local_78;
    if ((undefined1 *)vb != local_260) {
      operator_delete((void *)vb,local_260._0_8_ + 1);
      auVar39 = local_68;
      auVar40 = local_78;
    }
  }
  else {
    auVar37 = vmovshdup_avx(auVar13);
    auVar46 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * local_2d8)),ZEXT416((uint)fVar49),
                              ZEXT416((uint)local_2c8));
    auVar37 = vfmadd213ss_fma(auVar37,auVar39,auVar46);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl(ZEXT416((uint)(auVar37._0_4_ + -1.0)),auVar10);
    if (0.001 < auVar37._0_4_) goto LAB_003b9857;
  }
  local_308 = auVar44._0_4_;
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar51 * fVar43)),ZEXT416((uint)fVar49),
                            ZEXT416((uint)local_308));
  auVar37 = vfmadd231ss_fma(auVar37,auVar13,auVar39);
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx512vl(auVar37,auVar14);
  if (auVar37._0_4_ <= 0.001) {
    auVar37 = vfmadd213ss_fma(ZEXT416((uint)fVar49),ZEXT416((uint)fVar50),
                              ZEXT416((uint)(fVar51 * fVar52)));
    auVar39 = vfmadd213ss_fma(auVar39,auVar40,auVar37);
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar39 = vandps_avx512vl(auVar39,auVar37);
    if (auVar39._0_4_ <= 0.001) {
      auVar37 = vfmadd132ss_fma(ZEXT416((uint)fVar50),ZEXT416((uint)(fVar52 * local_2d8)),
                                ZEXT416((uint)local_2c8));
      auVar39 = vmovshdup_avx(auVar13);
      auVar40 = vfmadd213ss_fma(auVar40,auVar39,auVar37);
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar40 = vandps_avx512vl(auVar40,auVar15);
      if (auVar40._0_4_ <= 0.001) {
        auVar40 = vfmadd231ss_fma(ZEXT416((uint)(local_2d8 * fVar43)),auVar38,
                                  ZEXT416((uint)local_308));
        auVar39 = vfmadd231ss_fma(auVar40,auVar13,auVar39);
        auVar40._8_4_ = 0x7fffffff;
        auVar40._0_8_ = 0x7fffffff7fffffff;
        auVar40._12_4_ = 0x7fffffff;
        auVar39 = vandps_avx512vl(auVar39,auVar40);
        if (auVar39._0_4_ <= 0.001) goto LAB_003b9a14;
      }
    }
  }
  _uStack_268 = 0;
  vb = (size_t)local_260;
  local_260._0_8_ = local_260._0_8_ & 0xffffffffffffff00;
  detail::stringPrintfRecursive((string *)&vb,"Infinite light portal isn\'t a planar quadrilateral")
  ;
  Error((FileLoc *)0x0,(char *)vb);
  if ((undefined1 *)vb != local_260) {
    operator_delete((void *)vb,local_260._0_8_ + 1);
  }
LAB_003b9a14:
  auVar39 = vshufps_avx(auVar13,auVar13,0xe1);
  auVar47._0_4_ = local_308 * auVar39._0_4_;
  auVar47._4_4_ = auVar44._4_4_ * auVar39._4_4_;
  auVar47._8_4_ = auVar44._8_4_ * auVar39._8_4_;
  auVar47._12_4_ = auVar44._12_4_ * auVar39._12_4_;
  auVar10 = vshufps_avx(auVar11,auVar11,0xe1);
  auVar40 = vinsertps_avx(auVar44,auVar13,0x1c);
  auVar37 = vinsertps_avx(auVar44,auVar13,0x4c);
  auVar46 = vinsertps_avx(auVar44,auVar11,0x10);
  auVar39 = vblendps_avx(auVar10,auVar44,2);
  uVar6 = vmovlps_avx(auVar46);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  (this->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = auVar13._0_4_;
  uVar6 = vmovlps_avx(auVar39);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  fVar52 = (float)vextractps_avx(auVar13,1);
  (this->portalFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = fVar52;
  auVar39 = vfnmadd213ps_fma(auVar37,auVar40,auVar47);
  auVar13 = vfmsub213ps_fma(auVar10,auVar13,auVar47);
  auVar42._0_4_ = auVar13._0_4_ + auVar39._0_4_;
  auVar42._4_4_ = auVar13._4_4_ + auVar39._4_4_;
  auVar42._8_4_ = auVar13._8_4_ + auVar39._8_4_;
  auVar42._12_4_ = auVar13._12_4_ + auVar39._12_4_;
  auVar13 = vshufps_avx(auVar42,auVar42,0xe1);
  uVar6 = vmovlps_avx(auVar13);
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar6;
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  auVar11 = vfnmadd213ss_fma(auVar38,auVar11,ZEXT416((uint)(fVar43 * local_2c8)));
  auVar44 = vfmsub213ss_fma(auVar36,auVar44,ZEXT416((uint)(fVar43 * local_2c8)));
  (this->portalFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = auVar44._0_4_ + auVar11._0_4_;
  TVar8 = (equiAreaImage->resolution).super_Tuple2<pbrt::Point2,_int>;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)&d.allocator;
  std::__cxx11::string::_M_construct<char_const*>((string *)&d,"R","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"G","");
  plVar35 = local_a8;
  local_b8[0] = plVar35;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"B","");
  local_38.bits =
       (equiAreaImage->encoding).
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       .bits;
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d;
  Image::Image((Image *)&vb,Float,(Point2i)TVar8,channels,(ColorEncodingHandle *)&local_38,alloc);
  _Var30 = _vb;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y = uStack_268;
  this_00->format = (undefined4)vb;
  (this_00->resolution).super_Tuple2<pbrt::Point2,_int>.x = vb._4_4_;
  _vb = _Var30;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->image).channelNames,
              (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_260);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (uintptr_t)
         local_1c0.
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
            (&(this->image).p8,&local_1b8);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
            (&(this->image).p16,&local_198);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
            (&(this->image).p32,&local_178);
  local_178.nStored = 0;
  (*(local_178.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_178.alloc.memoryResource,local_178.ptr,local_178.nAlloc << 2,4);
  local_198.nStored = 0;
  (*(local_198.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_198.alloc.memoryResource,local_198.ptr,local_198.nAlloc * 2,2);
  local_1b8.nStored = 0;
  (*(local_1b8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_1b8.alloc.memoryResource,local_1b8.ptr,local_1b8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
  lVar33 = -0x60;
  do {
    if (plVar35 != (long *)plVar35[-2]) {
      operator_delete((long *)plVar35[-2],*plVar35 + 1);
    }
    plVar35 = plVar35 + -4;
    lVar33 = lVar33 + 0x20;
  } while (lVar33 != 0);
  TVar8 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  local_118 = (undefined8 *)0x0;
  uStack_110 = 0;
  pcStack_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118 = (undefined8 *)operator_new(0x18);
  *local_118 = this;
  pcStack_100 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_invoke;
  local_118[1] = renderFromLight;
  local_118[2] = equiAreaImage;
  pcStack_108 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:998:42)>
                ::_M_manager;
  _uStack_268 = 0;
  vb = (size_t)&local_118;
  local_260._8_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
       ::_M_invoke;
  local_260._0_8_ =
       std::
       _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
       ::_M_manager;
  ParallelFor(0,(long)TVar8 >> 0x20,(function<void_(long,_long)> *)&vb);
  if ((code *)local_260._0_8_ != (code *)0x0) {
    (*(code *)local_260._0_8_)(&vb,&vb,3);
  }
  if (pcStack_108 != (code *)0x0) {
    (*pcStack_108)(&local_118,&local_118,3);
  }
  auVar44._8_4_ = 0x3f800000;
  auVar44._0_8_ = 0x3f8000003f800000;
  auVar44._12_4_ = 0x3f800000;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<float_(pbrt::Point2<float>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp:1018:18)>
             ::_M_manager;
  _vb = (_Any_data)vmovlhps_avx(ZEXT816(0) << 0x40,auVar44);
  local_98._M_unused._M_object = this;
  alloc_00.memoryResource = pstd::pmr::new_delete_resource();
  Image::GetSamplingDistribution
            (&d,this_00,(function<float_(pbrt::Point2<float>)> *)&local_98,(Bounds2f *)&vb,alloc_00)
  ;
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  allocator.memoryResource = pstd::pmr::new_delete_resource();
  auVar39._8_8_ = 0;
  auVar39._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
  auVar39._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
  auVar45._8_8_ = 0;
  auVar45._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
  auVar45._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
  auVar44 = vpsubd_avx(auVar39,auVar45);
  Array2D<float>::Array2D<float_const*,void>
            (&local_58,d.values,d.values + auVar44._4_4_ * auVar44._0_4_,auVar44._0_4_,auVar44._4_4_
             ,allocator);
  WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
            ((WindowedPiecewiseConstant2D *)&vb,&local_58,alloc);
  Array2D<double>::operator=((Array2D<double> *)&this->distribution,(Array2D<double> *)&vb);
  Array2D<float>::operator=(&(this->distribution).func,(Array2D<float> *)local_250);
  Array2D<float>::~Array2D((Array2D<float> *)local_250);
  Array2D<double>::~Array2D((Array2D<double> *)&vb);
  Array2D<float>::~Array2D(&local_58);
  Array2D<float>::~Array2D(&d);
  channelDesc.offset.nStored = 0;
  (*(channelDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
            (channelDesc.offset.alloc.memoryResource,channelDesc.offset.ptr,
             channelDesc.offset.nAlloc << 2,4);
  return;
}

Assistant:

PortalImageInfiniteLight::PortalImageInfiniteLight(
    const Transform &renderFromLight, Image equiAreaImage,
    const RGBColorSpace *imageColorSpace, Float scale, const std::string &filename,
    std::vector<Point3f> p, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(alloc),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      distribution(alloc) {
    // Initialize sampling PDFs for infinite area light
    ImageChannelDesc channelDesc = equiAreaImage.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for PortalImageInfiniteLight doesn't have R, "
                  "G, B channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());

    if (equiAreaImage.Resolution().x != equiAreaImage.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an "
                  "equirect environment map.",
                  filename, equiAreaImage.Resolution().x, equiAreaImage.Resolution().y);

    if (p.size() != 4)
        ErrorExit("Expected 4 vertices for infinite light portal but given %d", p.size());
    for (int i = 0; i < 4; ++i)
        portal[i] = p[i];

    // Compute frame for portal coordinate system
    Vector3f p01 = Normalize(portal[1] - portal[0]);
    Vector3f p12 = Normalize(portal[2] - portal[1]);
    Vector3f p32 = Normalize(portal[2] - portal[3]);
    Vector3f p03 = Normalize(portal[3] - portal[0]);
    // Do opposite edges have the same direction?
    if (std::abs(Dot(p01, p32) - 1) > .001 || std::abs(Dot(p12, p03) - 1) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    // Sides perpendicular?
    if (std::abs(Dot(p01, p12)) > .001 || std::abs(Dot(p12, p32)) > .001 ||
        std::abs(Dot(p32, p03)) > .001 || std::abs(Dot(p03, p01)) > .001)
        Error("Infinite light portal isn't a planar quadrilateral");
    portalFrame = Frame::FromXY(p01, p03);

    // Resample environment map into rectified coordinates
    // Resample the latlong map into rectified coordinates
    image = Image(PixelFormat::Float, equiAreaImage.Resolution(), {"R", "G", "B"},
                  equiAreaImage.Encoding(), alloc);
    ParallelFor(0, image.Resolution().y, [&](int y) {
        for (int x = 0; x < image.Resolution().x; ++x) {
            // [0,1]^2 image coordinates
            Point2f st((x + 0.5f) / image.Resolution().x,
                       (y + 0.5f) / image.Resolution().y);

            Vector3f w = RenderFromImage(st);

            w = Normalize(renderFromLight.ApplyInverse(w));

            WrapMode2D equiAreaWrap(WrapMode::OctahedralSphere,
                                    WrapMode::OctahedralSphere);
            Point2f stEqui = EqualAreaSphereToSquare(w);
            for (int c = 0; c < 3; ++c)
                image.SetChannel({x, y}, c,
                                 equiAreaImage.BilerpChannel(stEqui, c, equiAreaWrap));
        }
    });

    // Initialize sampling PDFs for infinite area light
    auto duvdw = [&](const Point2f &p) {
        Float duv_dw;
        (void)RenderFromImage(p, &duv_dw);
        return duv_dw;
    };
    Array2D<Float> d = image.GetSamplingDistribution(duvdw);
    distribution = WindowedPiecewiseConstant2D(d, alloc);
}